

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O1

void __thiscall
dlib::con_<64l,1l,1l,1,1,0,0>::
setup<dlib::dimpl::subnet_wrapper<dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,true,void>>
          (con_<64l,1l,1l,1,1,0,0> *this,
          subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_true,_void>
          *sub)

{
  float *pfVar1;
  tensor *ptVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  tensor *ptVar8;
  float *pfVar9;
  long lVar10;
  undefined4 extraout_var;
  tensor *__range1;
  size_t new_size;
  float *val;
  undefined8 extraout_XMM0_Qa;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 extraout_var_01 [56];
  undefined1 auVar14 [64];
  rand rnd;
  alias_tensor_instance local_1440;
  rand local_13f8;
  undefined1 auVar13 [64];
  undefined1 extraout_var_00 [60];
  
  ptVar2 = sub->l->cached_output_ptr;
  ptVar8 = &(sub->l->cached_output).super_tensor;
  if (ptVar2 != (tensor *)0x0) {
    ptVar8 = ptVar2;
  }
  lVar3 = ptVar8->m_k;
  lVar4 = *(long *)(this + 0x168);
  new_size = ((ulong)(byte)this[0x178] + lVar3) * lVar4;
  *(size_t *)(this + 8) = new_size;
  *(undefined8 *)(this + 0x10) = 1;
  *(undefined8 *)(this + 0x18) = 1;
  *(undefined8 *)(this + 0x20) = 1;
  *(size_t *)(this + 0x28) = new_size;
  if (*(long *)(this + 0x30) < (long)new_size) {
    gpu_data::set_size((gpu_data *)(this + 0x30),new_size);
  }
  ::rand();
  rand::rand(&local_13f8);
  pfVar9 = (float *)(**(code **)(*(long *)this + 0x18))(this);
  lVar10 = (**(code **)(*(long *)this + 0x18))(this);
  auVar13._8_56_ = extraout_var_01;
  auVar13._0_8_ = extraout_XMM0_Qa;
  pfVar1 = (float *)(lVar10 + *(long *)(this + 0x28) * 4);
  if (pfVar9 != pfVar1) {
    auVar5 = vcvtusi2sd_avx512f(auVar13._0_16_,lVar4 + lVar3);
    auVar12._0_8_ = 6.0 / auVar5._0_8_;
    auVar12._8_8_ = 0;
    auVar5 = vsqrtsd_avx(auVar12,auVar12);
    do {
      auVar14._0_4_ = rand::get_random_float(&local_13f8);
      auVar14._4_60_ = extraout_var_00;
      auVar6 = vfmadd132ss_fma(auVar14._0_16_,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
      *pfVar9 = auVar6._0_4_;
      dVar11 = auVar5._0_8_;
      if (auVar12._0_8_ < 0.0) {
        dVar11 = sqrt(auVar12._0_8_);
      }
      *pfVar9 = (float)(dVar11 * (double)*pfVar9);
      pfVar9 = pfVar9 + 1;
    } while (pfVar9 != pfVar1);
  }
  lVar3 = *(long *)(this + 0x168);
  ptVar2 = sub->l->cached_output_ptr;
  ptVar8 = &(sub->l->cached_output).super_tensor;
  if (ptVar2 != (tensor *)0x0) {
    ptVar8 = ptVar2;
  }
  lVar4 = ptVar8->m_k;
  *(long *)(this + 0xa0) = lVar3;
  *(long *)(this + 0xa8) = lVar4;
  *(undefined8 *)(this + 0xb0) = 1;
  *(undefined8 *)(this + 0xb8) = 1;
  *(long *)(this + 0xc0) = lVar4 * lVar3;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  if (this[0x178] == (con_<64l,1l,1l,1,1,0,0>)0x1) {
    *(undefined8 *)(this + 0xe8) = 1;
    *(long *)(this + 0xf0) = lVar3;
    *(undefined8 *)(this + 0xf8) = 1;
    *(undefined8 *)(this + 0x100) = 1;
    *(long *)(this + 0x108) = lVar3;
    *(undefined8 *)(this + 0x110) = 0;
    *(undefined8 *)(this + 0x118) = 0;
    *(undefined8 *)(this + 0x120) = 0;
    alias_tensor::operator()
              (&local_1440,(alias_tensor *)(this + 0xe0),(tensor *)this,*(size_t *)(this + 0xc0));
    iVar7 = (*local_1440.super_tensor._vptr_tensor[4])();
    if (local_1440.super_tensor.m_size != 0) {
      memset((void *)CONCAT44(extraout_var,iVar7),0,local_1440.super_tensor.m_size << 2);
    }
  }
  local_13f8._vptr_rand = (_func_int **)&PTR__rand_001fb3f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13f8.seed._M_dataplus._M_p != &local_13f8.seed.field_2) {
    operator_delete(local_13f8.seed._M_dataplus._M_p,
                    local_13f8.seed.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            const long filt_nr = _nr!=0 ? _nr : sub.get_output().nr();
            const long filt_nc = _nc!=0 ? _nc : sub.get_output().nc();

            long num_inputs = filt_nr*filt_nc*sub.get_output().k();
            long num_outputs = num_filters_;
            // allocate params for the filters and also for the filter bias values.
            params.set_size(num_inputs*num_filters_ + static_cast<int>(use_bias) * num_filters_);

            dlib::rand rnd(std::rand());
            randomize_parameters(params, num_inputs+num_outputs, rnd);

            filters = alias_tensor(num_filters_, sub.get_output().k(), filt_nr, filt_nc);
            if (use_bias)
            {
                biases = alias_tensor(1,num_filters_);
                // set the initial bias values to zero
                biases(params,filters.size()) = 0;
            }
        }